

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void wasm::SimplifyLocals<true,_true,_true>::visitPre
               (SimplifyLocals<true,_true,_true> *self,Expression **currp)

{
  bool bVar1;
  reference __in;
  type *__x;
  type *ptVar2;
  reference puVar3;
  PassOptions *passOptions;
  Module *module;
  undefined1 local_1f8 [8];
  EffectAnalyzer effects;
  iterator iStack_90;
  uint index_1;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  type *info;
  type *index;
  _Self local_50;
  iterator __end0;
  iterator __begin0;
  Sinkables *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> invalidated;
  Expression *curr;
  Expression **currp_local;
  SimplifyLocals<true,_true,_true> *self_local;
  
  invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)*currp;
  bVar1 = Expression::is<wasm::Try>
                    ((Expression *)
                     invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((bVar1) ||
     (bVar1 = Expression::is<wasm::TryTable>
                        ((Expression *)
                         invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    __end0 = std::
             map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             ::begin(&self->sinkables);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
         ::end(&self->sinkables);
    while (bVar1 = std::operator!=(&__end0,&local_50), bVar1) {
      __in = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
             ::operator*(&__end0);
      __x = std::get<0ul,unsigned_int_const,wasm::SimplifyLocals<true,true,true>::SinkableInfo>
                      (__in);
      ptVar2 = std::get<1ul,unsigned_int_const,wasm::SimplifyLocals<true,true,true>::SinkableInfo>
                         (__in);
      bVar1 = EffectAnalyzer::throws(&ptVar2->effects);
      if (bVar1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,__x);
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
      ::operator++(&__end0);
    }
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    iStack_90 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff70), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *puVar3;
      std::
      map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
      ::erase(&self->sinkables,
              (key_type *)
              ((long)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 4))
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end3);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
  }
  passOptions = Pass::getPassOptions((Pass *)self);
  module = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
           ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(self->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      );
  EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_1f8,passOptions,module);
  bVar1 = EffectAnalyzer::checkPre
                    ((EffectAnalyzer *)local_1f8,
                     (Expression *)
                     invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    checkInvalidations(self,(EffectAnalyzer *)local_1f8);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1f8);
  return;
}

Assistant:

static void
  visitPre(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
           Expression** currp) {
    Expression* curr = *currp;

    // Certain expressions cannot be sinked into 'try'/'try_table', and so at
    // the start of 'try'/'try_table' we forget about them.
    if (curr->is<Try>() || curr->is<TryTable>()) {
      std::vector<Index> invalidated;
      for (auto& [index, info] : self->sinkables) {
        // Expressions that may throw cannot be moved into a try (which might
        // catch them, unlike before the move).
        if (info.effects.throws()) {
          invalidated.push_back(index);
          continue;
        }
      }
      for (auto index : invalidated) {
        self->sinkables.erase(index);
      }
    }

    EffectAnalyzer effects(self->getPassOptions(), *self->getModule());
    if (effects.checkPre(curr)) {
      self->checkInvalidations(effects);
    }

    if (!allowNesting) {
      self->expressionStack.push_back(curr);
    }
  }